

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

SubArchType parseSubArch(StringRef SubArchName)

{
  bool bVar1;
  ArchKind AVar2;
  SubArchType *pSVar3;
  size_t in_RDX;
  StringRef Arch;
  StringLiteral local_208;
  StringLiteral local_1f8;
  StringLiteral local_1e8;
  size_t local_1d8;
  char *local_1d0;
  StringRef local_1c8;
  Optional<llvm::Triple::SubArchType> OStack_1b8;
  ARM *local_1b0;
  char *local_1a8;
  undefined1 auStack_1a0 [8];
  StringRef ARMSubArch;
  StringRef SubArchName_local;
  SubArchType local_144;
  StringRef *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  SubArchType local_114;
  StringRef *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  SubArchType local_e4;
  StringRef *local_e0;
  char *local_d8;
  char *local_d0;
  SubArchType local_c4;
  StringRef *local_c0;
  SubArchType local_b4;
  StringRef *local_b0;
  char *local_a8;
  char *local_a0;
  StringRef *local_98;
  char *local_90;
  char *local_88;
  StringRef *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  iterator local_58;
  int local_4c;
  char *local_48;
  char *local_40;
  iterator local_38;
  int local_2c;
  char *local_28;
  char *local_20;
  iterator local_18;
  int local_c;
  
  Arch.Data = (char *)SubArchName.Length;
  local_1b0 = (ARM *)SubArchName.Data;
  Arch.Length = in_RDX;
  local_1a8 = Arch.Data;
  ARMSubArch.Length = (size_t)local_1b0;
  _auStack_1a0 = llvm::ARM::getCanonicalArchName(local_1b0,Arch);
  if (ARMSubArch.Data == (char *)0x0) {
    local_1d8 = ARMSubArch.Length;
    local_1c8.Data = (char *)ARMSubArch.Length;
    local_1d0 = Arch.Data;
    local_1c8.Length = (size_t)Arch.Data;
    llvm::Optional<llvm::Triple::SubArchType>::Optional(&OStack_1b8);
    llvm::StringLiteral::StringLiteral<9UL>(&local_1e8,(char (*) [9])"kalimba3");
    local_d8 = local_1e8.super_StringRef.Data;
    local_d0 = (char *)local_1e8.super_StringRef.Length;
    local_e4 = KalimbaSubArch_v3;
    local_e0 = &local_1c8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1b8);
    if (!bVar1) {
      local_f8 = local_d8;
      local_f0 = local_d0;
      local_a8 = local_d8;
      local_a0 = local_d0;
      bVar1 = false;
      local_b0 = &local_1c8;
      if (local_d0 <= local_1c8.Length) {
        local_18 = llvm::StringRef::end(&local_1c8);
        local_18 = local_18 + -(long)local_a0;
        local_20 = local_a8;
        local_28 = local_a0;
        if (local_a0 == (char *)0x0) {
          local_c = 0;
        }
        else {
          local_c = memcmp(local_18,local_a8,(size_t)local_a0);
        }
        bVar1 = local_c == 0;
      }
      if (bVar1) {
        llvm::Optional<llvm::Triple::SubArchType>::operator=(&OStack_1b8,&local_e4);
      }
    }
    llvm::StringLiteral::StringLiteral<9UL>(&local_1f8,(char (*) [9])"kalimba4");
    local_108 = local_1f8.super_StringRef.Data;
    local_100 = (char *)local_1f8.super_StringRef.Length;
    local_114 = KalimbaSubArch_v4;
    local_110 = &local_1c8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1b8);
    if (!bVar1) {
      local_128 = local_108;
      local_120 = local_100;
      local_90 = local_108;
      local_88 = local_100;
      bVar1 = false;
      local_98 = &local_1c8;
      if (local_100 <= local_1c8.Length) {
        local_38 = llvm::StringRef::end(&local_1c8);
        local_38 = local_38 + -(long)local_88;
        local_40 = local_90;
        local_48 = local_88;
        if (local_88 == (char *)0x0) {
          local_2c = 0;
        }
        else {
          local_2c = memcmp(local_38,local_90,(size_t)local_88);
        }
        bVar1 = local_2c == 0;
      }
      if (bVar1) {
        llvm::Optional<llvm::Triple::SubArchType>::operator=(&OStack_1b8,&local_114);
      }
    }
    llvm::StringLiteral::StringLiteral<9UL>(&local_208,(char (*) [9])"kalimba5");
    local_138 = local_208.super_StringRef.Data;
    local_130 = (char *)local_208.super_StringRef.Length;
    local_144 = KalimbaSubArch_v5;
    local_140 = &local_1c8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1b8);
    if (!bVar1) {
      local_78 = local_138;
      local_70 = local_130;
      bVar1 = false;
      local_80 = &local_1c8;
      if (local_130 <= local_1c8.Length) {
        local_58 = llvm::StringRef::end(&local_1c8);
        local_58 = local_58 + -(long)local_70;
        local_60 = local_78;
        local_68 = local_70;
        if (local_70 == (char *)0x0) {
          local_4c = 0;
        }
        else {
          local_4c = memcmp(local_58,local_78,(size_t)local_70);
        }
        bVar1 = local_4c == 0;
      }
      if (bVar1) {
        llvm::Optional<llvm::Triple::SubArchType>::operator=(&OStack_1b8,&local_144);
      }
    }
    local_c4 = NoSubArch;
    local_c0 = &local_1c8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1b8);
    if (bVar1) {
      pSVar3 = llvm::Optional<llvm::Triple::SubArchType>::operator*(&OStack_1b8);
      local_b4 = *pSVar3;
    }
    else {
      local_b4 = local_c4;
    }
    SubArchName_local.Length._4_4_ = local_b4;
  }
  else {
    AVar2 = llvm::ARM::parseArch(_auStack_1a0);
    switch(AVar2) {
    case ARMV4:
      SubArchName_local.Length._4_4_ = NoSubArch;
      break;
    case ARMV4T:
      SubArchName_local.Length._4_4_ = ARMSubArch_v4t;
      break;
    case ARMV5T:
      SubArchName_local.Length._4_4_ = ARMSubArch_v5;
      break;
    case ARMV5TE:
    case ARMV5TEJ:
    case IWMMXT:
    case IWMMXT2:
    case XSCALE:
      SubArchName_local.Length._4_4_ = ARMSubArch_v5te;
      break;
    case ARMV6:
      SubArchName_local.Length._4_4_ = ARMSubArch_v6;
      break;
    case ARMV6K:
    case ARMV6KZ:
      SubArchName_local.Length._4_4_ = ARMSubArch_v6k;
      break;
    case ARMV6T2:
      SubArchName_local.Length._4_4_ = ARMSubArch_v6t2;
      break;
    case ARMV6M:
      SubArchName_local.Length._4_4_ = ARMSubArch_v6m;
      break;
    case ARMV7A:
    case ARMV7R:
      SubArchName_local.Length._4_4_ = ARMSubArch_v7;
      break;
    case ARMV7VE:
      SubArchName_local.Length._4_4_ = ARMSubArch_v7ve;
      break;
    case ARMV7M:
      SubArchName_local.Length._4_4_ = ARMSubArch_v7m;
      break;
    case ARMV7EM:
      SubArchName_local.Length._4_4_ = ARMSubArch_v7em;
      break;
    case ARMV8A:
      SubArchName_local.Length._4_4_ = ARMSubArch_v8;
      break;
    case ARMV8_1A:
      SubArchName_local.Length._4_4_ = ARMSubArch_v8_1a;
      break;
    case ARMV8_2A:
      SubArchName_local.Length._4_4_ = ARMSubArch_v8_2a;
      break;
    case ARMV8_3A:
      SubArchName_local.Length._4_4_ = ARMSubArch_v8_3a;
      break;
    case ARMV8_4A:
      SubArchName_local.Length._4_4_ = ARMSubArch_v8_4a;
      break;
    case ARMV8R:
      SubArchName_local.Length._4_4_ = ARMSubArch_v8r;
      break;
    case ARMV8MBaseline:
      SubArchName_local.Length._4_4_ = ARMSubArch_v8m_baseline;
      break;
    case ARMV8MMainline:
      SubArchName_local.Length._4_4_ = ARMSubArch_v8m_mainline;
      break;
    case ARMV7S:
      SubArchName_local.Length._4_4_ = ARMSubArch_v7s;
      break;
    case ARMV7K:
      SubArchName_local.Length._4_4_ = ARMSubArch_v7k;
      break;
    default:
      SubArchName_local.Length._4_4_ = NoSubArch;
    }
  }
  return SubArchName_local.Length._4_4_;
}

Assistant:

static Triple::SubArchType parseSubArch(StringRef SubArchName) {
  StringRef ARMSubArch = ARM::getCanonicalArchName(SubArchName);

  // For now, this is the small part. Early return.
  if (ARMSubArch.empty())
    return StringSwitch<Triple::SubArchType>(SubArchName)
      .EndsWith("kalimba3", Triple::KalimbaSubArch_v3)
      .EndsWith("kalimba4", Triple::KalimbaSubArch_v4)
      .EndsWith("kalimba5", Triple::KalimbaSubArch_v5)
      .Default(Triple::NoSubArch);

  // ARM sub arch.
  switch(ARM::parseArch(ARMSubArch)) {
  case ARM::ArchKind::ARMV4:
    return Triple::NoSubArch;
  case ARM::ArchKind::ARMV4T:
    return Triple::ARMSubArch_v4t;
  case ARM::ArchKind::ARMV5T:
    return Triple::ARMSubArch_v5;
  case ARM::ArchKind::ARMV5TE:
  case ARM::ArchKind::IWMMXT:
  case ARM::ArchKind::IWMMXT2:
  case ARM::ArchKind::XSCALE:
  case ARM::ArchKind::ARMV5TEJ:
    return Triple::ARMSubArch_v5te;
  case ARM::ArchKind::ARMV6:
    return Triple::ARMSubArch_v6;
  case ARM::ArchKind::ARMV6K:
  case ARM::ArchKind::ARMV6KZ:
    return Triple::ARMSubArch_v6k;
  case ARM::ArchKind::ARMV6T2:
    return Triple::ARMSubArch_v6t2;
  case ARM::ArchKind::ARMV6M:
    return Triple::ARMSubArch_v6m;
  case ARM::ArchKind::ARMV7A:
  case ARM::ArchKind::ARMV7R:
    return Triple::ARMSubArch_v7;
  case ARM::ArchKind::ARMV7VE:
    return Triple::ARMSubArch_v7ve;
  case ARM::ArchKind::ARMV7K:
    return Triple::ARMSubArch_v7k;
  case ARM::ArchKind::ARMV7M:
    return Triple::ARMSubArch_v7m;
  case ARM::ArchKind::ARMV7S:
    return Triple::ARMSubArch_v7s;
  case ARM::ArchKind::ARMV7EM:
    return Triple::ARMSubArch_v7em;
  case ARM::ArchKind::ARMV8A:
    return Triple::ARMSubArch_v8;
  case ARM::ArchKind::ARMV8_1A:
    return Triple::ARMSubArch_v8_1a;
  case ARM::ArchKind::ARMV8_2A:
    return Triple::ARMSubArch_v8_2a;
  case ARM::ArchKind::ARMV8_3A:
    return Triple::ARMSubArch_v8_3a;
  case ARM::ArchKind::ARMV8_4A:
    return Triple::ARMSubArch_v8_4a;
  case ARM::ArchKind::ARMV8R:
    return Triple::ARMSubArch_v8r;
  case ARM::ArchKind::ARMV8MBaseline:
    return Triple::ARMSubArch_v8m_baseline;
  case ARM::ArchKind::ARMV8MMainline:
    return Triple::ARMSubArch_v8m_mainline;
  default:
    return Triple::NoSubArch;
  }
}